

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::updateThresholdUbChange
          (HighsDomain *this,HighsInt col,double newbound,double val,double *threshold)

{
  initializer_list<double> __l;
  reference pvVar1;
  double *in_RDX;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double thresholdNew;
  undefined4 uVar3;
  HighsInt col_00;
  HighsDomain *this_00;
  HighsVarType var_type;
  double in_stack_ffffffffffffffa8;
  double in_stack_ffffffffffffffb0;
  
  dVar2 = in_XMM0_Qa;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x308),(long)in_ESI);
  if ((dVar2 != *pvVar1) || (NAN(dVar2) || NAN(*pvVar1))) {
    uVar3 = SUB84(in_XMM0_Qa,0);
    col_00 = (HighsInt)((ulong)in_XMM0_Qa >> 0x20);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x308),(long)in_ESI);
    var_type = (HighsVarType)((ulong)in_RDI >> 0x38);
    this_00 = (HighsDomain *)*pvVar1;
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x5c31fe)
    ;
    variableType(this_00,col_00);
    boundRange(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,dVar2,var_type);
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x5c3279)
    ;
    __l._M_array._4_4_ = col_00;
    __l._M_array._0_4_ = uVar3;
    __l._M_len = (size_type)this_00;
    dVar2 = std::max<double>(__l);
    *in_RDX = dVar2;
  }
  return;
}

Assistant:

void HighsDomain::updateThresholdUbChange(HighsInt col, double newbound,
                                          double val, double& threshold) {
  if (newbound != col_lower_[col]) {
    double thresholdNew =
        std::fabs(val) * boundRange(newbound, col_lower_[col],
                                    mipsolver->mipdata_->feastol,
                                    variableType(col));

    // the new threshold is now the maximum of the new threshold and the current
    // one
    threshold =
        std::max({threshold, thresholdNew, mipsolver->mipdata_->feastol});
  }
}